

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAppender.h
# Opt level: O0

void aeron::concurrent::logbuffer::TermAppender::checkTerm(int32_t expectedTermId,int32_t termId)

{
  IllegalStateException *this;
  char *pcVar1;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int32_t local_10;
  int local_c;
  int32_t termId_local;
  int32_t expectedTermId_local;
  
  if (termId != expectedTermId) {
    local_10 = termId;
    local_c = expectedTermId;
    this = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_90,local_c);
    std::operator+(&local_70,"action possibly delayed: expectedTermId=",&local_90);
    std::operator+(&local_50,&local_70," termId=");
    std::__cxx11::to_string(&local_c0,local_10);
    std::operator+(&local_30,&local_50,&local_c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,
               "static void aeron::concurrent::logbuffer::TermAppender::checkTerm(std::int32_t, std::int32_t)"
               ,&local_e1);
    pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/TermAppender.h"
                              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,pcVar1,&local_109);
    util::IllegalStateException::IllegalStateException(this,&local_30,&local_e0,&local_108,0x165);
    __cxa_throw(this,&util::IllegalStateException::typeinfo,
                util::IllegalStateException::~IllegalStateException);
  }
  return;
}

Assistant:

inline static void checkTerm(std::int32_t expectedTermId, std::int32_t termId)
    {
        if (termId != expectedTermId)
        {
            throw util::IllegalStateException(
                "action possibly delayed: expectedTermId=" + std::to_string(expectedTermId) +
                " termId=" + std::to_string(termId), SOURCEINFO);
        }
    }